

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool parse_simplified_vrp_line
                (Instance *instance,FILE *filehandle,char *filepath,int32_t *line_cnt)

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  int32_t expected_idx;
  int32_t num_read;
  double dual;
  double demand;
  double y;
  double x;
  uint *puStack_30;
  int32_t idx;
  int32_t *line_cnt_local;
  char *filepath_local;
  FILE *filehandle_local;
  Instance *instance_local;
  
  x._4_4_ = 0;
  y = 0.0;
  demand = 0.0;
  dual = 0.0;
  _expected_idx = 0;
  puStack_30 = (uint *)line_cnt;
  line_cnt_local = (int32_t *)filepath;
  filepath_local = (char *)filehandle;
  filehandle_local = (FILE *)instance;
  iVar3 = __isoc99_fscanf(filehandle,"%d %lf %lf %lf %lf",(long)&x + 4,&y,&demand,&dual,
                          &expected_idx);
  *puStack_30 = *puStack_30 + 1;
  if (iVar3 == -1) {
    instance_local._7_1_ = false;
  }
  else if (iVar3 == 5) {
    if (x._4_4_ == *puStack_30 - 2) {
      _Var2 = expect_newline((FILE *)filepath_local,(char *)line_cnt_local,*puStack_30);
      if (_Var2) {
        pcVar1 = filehandle_local->_IO_write_ptr;
        *(double *)(pcVar1 + (long)(int)x._4_4_ * 0x10) = y;
        *(double *)((long)(pcVar1 + (long)(int)x._4_4_ * 0x10) + 8) = demand;
        *(double *)(filehandle_local->_IO_write_end + (long)(int)x._4_4_ * 8) = dual;
        *(undefined8 *)(filehandle_local->_IO_buf_base + (long)(int)x._4_4_ * 8) = _expected_idx;
        instance_local._7_1_ = true;
      }
      else {
        instance_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"%s: Parsing error at line %d. Expected idx %d but found %d\n",line_cnt_local,
              (ulong)*puStack_30,(ulong)(*puStack_30 - 2),(ulong)x._4_4_);
      instance_local._7_1_ = false;
    }
  }
  else {
    fprintf(_stderr,"%s: Parsing error at line %d\n",line_cnt_local,(ulong)*puStack_30);
    instance_local._7_1_ = false;
  }
  return instance_local._7_1_;
}

Assistant:

static bool parse_simplified_vrp_line(Instance *instance, FILE *filehandle,
                                      const char *filepath, int32_t *line_cnt) {

    int32_t idx = 0;
    double x = 0.0, y = 0.0;
    double demand = 0.0;
    double dual = 0.0;

    int32_t num_read =
        fscanf(filehandle, "%d %lf %lf %lf %lf", &idx, &x, &y, &demand, &dual);

    *line_cnt = *line_cnt + 1;
    int32_t expected_idx = *line_cnt - 2;

    if (num_read == EOF) {
        return false;
    }

    if (num_read != 5) {
        fprintf(stderr, "%s: Parsing error at line %d\n", filepath, *line_cnt);
        return false;
    }

    if (idx != expected_idx) {
        fprintf(stderr,
                "%s: Parsing error at line %d. Expected idx %d but found %d\n",
                filepath, *line_cnt, expected_idx, idx);
        return false;
    }

    if (!expect_newline(filehandle, filepath, *line_cnt)) {
        return false;
    }

    instance->positions[idx] = (Vec2d){x, y};
    instance->demands[idx] = demand;
    instance->profits[idx] = dual;

    return true;
}